

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O1

void __thiscall
pstack::Procman::LiveProcess::LiveProcess
          (LiveProcess *this,Context *context,sptr *ex,pid_t pid_,bool alreadyStopped)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  undefined8 in_RAX;
  mapped_type *pmVar3;
  long *local_c0 [2];
  long local_b0 [2];
  sptr local_a0;
  long *local_90 [2];
  long local_80 [2];
  CacheReader *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  LiveReader *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  sptr local_50;
  pid_t local_3c;
  undefined4 local_38;
  pid_t pid__local;
  
  peVar2 = (ex->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),peVar2 != (element_type *)0x0);
  local_3c = pid_;
  if (peVar2 == (element_type *)0x0) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"exe","");
    pstack::Context::procname((int)local_c0,(string *)context);
    pstack::Context::getImageForName((string *)&local_50,SUB81(context,0));
  }
  else {
    local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (ex->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    if (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
  }
  pid__local._3_1_ = peVar2 == (element_type *)0x0;
  local_60 = (LiveReader *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstack::Procman::LiveReader,std::allocator<pstack::Procman::LiveReader>,pstack::Context&,int&,char_const(&)[4]>
            (&local_58,&local_60,(allocator<pstack::Procman::LiveReader> *)((long)&pid__local + 2),
             context,&local_3c,(char (*) [4])"mem");
  std::__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pstack::Procman::LiveReader,pstack::Procman::LiveReader>
            ((__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             local_60);
  local_70 = (CacheReader *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstack::CacheReader,std::allocator<pstack::CacheReader>,std::shared_ptr<pstack::Procman::LiveReader>>
            (&_Stack_68,&local_70,(allocator<pstack::CacheReader> *)((long)&pid__local + 2),
             (shared_ptr<pstack::Procman::LiveReader> *)&local_60);
  std::__shared_ptr<pstack::CacheReader,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pstack::CacheReader,pstack::CacheReader>
            ((__shared_ptr<pstack::CacheReader,(__gnu_cxx::_Lock_policy)2> *)&local_70,local_70);
  local_a0.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70;
  local_a0.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_68._M_pi;
  local_70 = (CacheReader *)0x0;
  _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Process::Process(&this->super_Process,context,&local_50,&local_a0);
  if (local_a0.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  if (peVar2 == (element_type *)0x0) {
    if (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
  }
  else if (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Process)._vptr_Process = (_func_int **)&PTR_findRDebugAddr_0013f280;
  this->pid = local_3c;
  p_Var1 = &(this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stoppedLWPs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ps_getpid((ps_prochandle *)this);
  if (alreadyStopped) {
    pmVar3 = std::
             map<int,_pstack::Procman::LiveProcess::Lwp,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Procman::LiveProcess::Lwp>_>_>
             ::operator[](&this->stoppedLWPs,&this->pid);
    pmVar3->stopCount = 1;
  }
  return;
}

Assistant:

LiveProcess::LiveProcess(Context &context, Elf::Object::sptr &ex, pid_t pid_, bool alreadyStopped)
    : Process(
            context,
            ex ? ex : context.getImageForName(context.procname(pid_, "exe")),
            std::make_shared<CacheReader>(std::make_shared<LiveReader>(context, pid_, "mem")))
    , pid(pid_)
{
    (void)ps_getpid(this);
    if (alreadyStopped)
       stoppedLWPs[pid].stopCount = 1;
}